

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O2

void sd_offset_update<sparse_parameters>
               (sparse_parameters *weights,features *fs,uint64_t offset,float update,
               float regularization)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  weight *pwVar4;
  size_t i;
  ulong uVar5;
  
  for (uVar5 = 0; pfVar3 = (fs->values)._begin,
      uVar5 < (ulong)((long)(fs->values)._end - (long)pfVar3 >> 2); uVar5 = uVar5 + 1) {
    fVar1 = pfVar3[uVar5];
    pwVar4 = sparse_parameters::operator[](weights,(fs->indicies)._begin[uVar5]);
    fVar2 = pwVar4[offset];
    pwVar4 = sparse_parameters::operator[](weights,(fs->indicies)._begin[uVar5]);
    pwVar4[offset] = (fVar1 * update - fVar2 * regularization) + pwVar4[offset];
  }
  return;
}

Assistant:

void sd_offset_update(T& weights, features& fs, uint64_t offset, float update, float regularization)
{
  for (size_t i = 0; i < fs.size(); i++)
    (&weights[fs.indicies[i]])[offset] += update * fs.values[i] - regularization * (&weights[fs.indicies[i]])[offset];
}